

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

Info * __thiscall EOPlus::Parser::ParseMain(Info *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Parser_Error *pPVar4;
  pointer pPVar5;
  Token *t_00;
  Token local_340;
  string local_2f0;
  allocator<char> local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  undefined1 local_242;
  allocator<char> local_241;
  string local_240;
  string local_220;
  undefined1 local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b2;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  undefined1 local_16a;
  allocator<char> local_169;
  string local_168;
  string local_148;
  string local_128;
  undefined1 local_102;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  variant local_b0;
  undefined1 local_70 [8];
  Token t;
  bool has_version;
  bool has_questname;
  Parser *this_local;
  Info *info;
  
  t._79_1_ = 0;
  t._78_1_ = 0;
  t._77_1_ = 0;
  Info::Info(__return_storage_ptr__);
  util::variant::variant(&local_b0);
  Token::Token((Token *)local_70,Invalid,&local_b0);
  util::variant::~variant(&local_b0);
  do {
    while( true ) {
      bVar1 = GetToken(this,(Token *)local_70,0x41);
      if (!bVar1) goto LAB_0017bd63;
      if (local_70._0_4_ != Identifier) break;
      util::variant::operator_cast_to_string(&local_e0,(variant *)&t);
      bVar1 = std::operator==(&local_e0,"questname");
      std::__cxx11::string::~string((string *)&local_e0);
      if (bVar1) {
        if ((t._79_1_ & 1) != 0) {
          local_102 = 1;
          pPVar4 = (Parser_Error *)__cxa_allocate_exception(0x18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"Main-block can only contain one questname.",&local_101);
          pPVar5 = std::
                   unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ::operator->(&this->tok);
          iVar3 = Parser_Token_Server_Base::RejectLine(pPVar5);
          Parser_Error::Parser_Error(pPVar4,&local_100,iVar3);
          local_102 = 0;
          __cxa_throw(pPVar4,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
        }
        t._79_1_ = 1;
        ParseQuestName_abi_cxx11_(&local_128,this);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_128);
        std::__cxx11::string::~string((string *)&local_128);
      }
      else {
        util::variant::operator_cast_to_string(&local_148,(variant *)&t);
        bVar1 = std::operator==(&local_148,"version");
        std::__cxx11::string::~string((string *)&local_148);
        if (bVar1) {
          if ((t._78_1_ & 1) != 0) {
            local_16a = 1;
            pPVar4 = (Parser_Error *)__cxa_allocate_exception(0x18);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_168,"Main-block can only contain one version.",&local_169);
            pPVar5 = std::
                     unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ::operator->(&this->tok);
            iVar3 = Parser_Token_Server_Base::RejectLine(pPVar5);
            Parser_Error::Parser_Error(pPVar4,&local_168,iVar3);
            local_16a = 0;
            __cxa_throw(pPVar4,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
          }
          t._78_1_ = 1;
          uVar2 = ParseVersion(this);
          __return_storage_ptr__->version = uVar2;
        }
        else {
          util::variant::operator_cast_to_string(&local_190,(variant *)&t);
          bVar1 = std::operator==(&local_190,"hidden");
          std::__cxx11::string::~string((string *)&local_190);
          if (bVar1) {
            if (__return_storage_ptr__->hidden != NotHidden) {
              local_1b2 = 1;
              pPVar4 = (Parser_Error *)__cxa_allocate_exception(0x18);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1b0,"Main-block can only contain one hidden attribute.",
                         &local_1b1);
              pPVar5 = std::
                       unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       ::operator->(&this->tok);
              iVar3 = Parser_Token_Server_Base::RejectLine(pPVar5);
              Parser_Error::Parser_Error(pPVar4,&local_1b0,iVar3);
              local_1b2 = 0;
              __cxa_throw(pPVar4,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
            }
            __return_storage_ptr__->hidden = Hidden;
          }
          else {
            util::variant::operator_cast_to_string(&local_1d8,(variant *)&t);
            bVar1 = std::operator==(&local_1d8,"hidden_end");
            std::__cxx11::string::~string((string *)&local_1d8);
            if (bVar1) {
              if (__return_storage_ptr__->hidden != NotHidden) {
                local_1fa = 1;
                pPVar4 = (Parser_Error *)__cxa_allocate_exception(0x18);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1f8,"Main-block can only contain one hidden attribute.",
                           &local_1f9);
                pPVar5 = std::
                         unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                         ::operator->(&this->tok);
                iVar3 = Parser_Token_Server_Base::RejectLine(pPVar5);
                Parser_Error::Parser_Error(pPVar4,&local_1f8,iVar3);
                local_1fa = 0;
                __cxa_throw(pPVar4,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
              }
              __return_storage_ptr__->hidden = HiddenEnd;
            }
            else {
              util::variant::operator_cast_to_string(&local_220,(variant *)&t);
              bVar1 = std::operator==(&local_220,"disabled");
              std::__cxx11::string::~string((string *)&local_220);
              if (!bVar1) goto LAB_0017bd63;
              if ((__return_storage_ptr__->disabled & 1U) != 0) {
                local_242 = 1;
                pPVar4 = (Parser_Error *)__cxa_allocate_exception(0x18);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_240,
                           "Main-block can only contain one disabled attribute.",&local_241);
                pPVar5 = std::
                         unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                         ::operator->(&this->tok);
                iVar3 = Parser_Token_Server_Base::RejectLine(pPVar5);
                Parser_Error::Parser_Error(pPVar4,&local_240,iVar3);
                local_242 = 0;
                __cxa_throw(pPVar4,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
              }
              __return_storage_ptr__->disabled = true;
            }
          }
        }
      }
    }
  } while (local_70._0_4_ != Symbol);
  util::variant::operator_cast_to_string(&local_268,(variant *)&t);
  bVar1 = std::operator==(&local_268,"}");
  std::__cxx11::string::~string((string *)&local_268);
  if (bVar1) {
    t._77_1_ = 1;
    Token::~Token((Token *)local_70);
    if ((t._77_1_ & 1) == 0) {
      Info::~Info(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
LAB_0017bd63:
  pPVar4 = (Parser_Error *)__cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,
             "Expected main-block entry (questname/version/hidden/hidden_end/disabled) or closing brace \'}\'."
             ,&local_2c9);
  std::operator+(&local_2a8,&local_2c8," Got: ");
  pPVar5 = std::
           unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ::operator->(&this->tok);
  Parser_Token_Server_Base::RejectToken(&local_340,pPVar5);
  token_got_string_abi_cxx11_(&local_2f0,(EOPlus *)&local_340,t_00);
  std::operator+(&local_288,&local_2a8,&local_2f0);
  pPVar5 = std::
           unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ::operator->(&this->tok);
  iVar3 = Parser_Token_Server_Base::RejectLine(pPVar5);
  Parser_Error::Parser_Error(pPVar4,&local_288,iVar3);
  __cxa_throw(pPVar4,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
}

Assistant:

Info Parser::ParseMain()
	{
		bool has_questname = false;
		bool has_version = false;
		Info info;
		Token t;

		while (this->GetToken(t, Token::Identifier | Token::Symbol))
		{
			if (t.type == Token::Identifier)
			{
				if (std::string(t.data) == "questname")
				{
					if (has_questname)
						PARSER_ERROR("Main-block can only contain one questname.");

					has_questname = true;
					info.name = ParseQuestName();
				}
				else if (std::string(t.data) == "version")
				{
					if (has_version)
						PARSER_ERROR("Main-block can only contain one version.");

					has_version = true;
					info.version = ParseVersion();
				}
				else if (std::string(t.data) == "hidden")
				{
					if (info.hidden != Info::NotHidden)
						PARSER_ERROR("Main-block can only contain one hidden attribute.");

					info.hidden = Info::Hidden;
				}
				else if (std::string(t.data) == "hidden_end")
				{
					if (info.hidden != Info::NotHidden)
						PARSER_ERROR("Main-block can only contain one hidden attribute.");

					info.hidden = Info::HiddenEnd;
				}
				else if (std::string(t.data) == "disabled")
				{
					if (info.disabled)
						PARSER_ERROR("Main-block can only contain one disabled attribute.");

					info.disabled = true;
				}
				else
				{
					break;
				}
			}
			else if (t.type == Token::Symbol)
			{
				if (std::string(t.data) == "}")
					return info;
				else
					break;
			}
		}

		PARSER_ERROR_GOT("Expected main-block entry (questname/version/hidden/hidden_end/disabled) or closing brace '}'.");
	}